

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<int&,int&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args,int *args_1)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int unused;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffb70;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffb78;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffb80;
  basic_appender<char> *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffbb8;
  level_enum in_stack_fffffffffffffbdc;
  log_msg *in_stack_fffffffffffffbe0;
  string_view_t in_stack_fffffffffffffbe8;
  string_view_t in_stack_fffffffffffffbf8;
  source_loc in_stack_fffffffffffffc10;
  basic_string_view<char> local_398 [2];
  undefined8 local_378;
  undefined8 uStack_370;
  log_msg *local_368;
  buffer<char> *local_300;
  undefined4 local_2f8 [4];
  undefined4 local_2e8 [6];
  undefined8 local_2d0;
  undefined4 *local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  basic_appender<char> local_2b0 [4];
  buffer<char> local_290 [9];
  undefined1 local_16a;
  byte local_169;
  undefined4 *local_168;
  undefined4 *local_160;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 *local_138;
  undefined4 *local_130;
  undefined4 local_124;
  undefined4 *local_120;
  undefined4 local_114;
  undefined4 *local_110;
  undefined4 *local_108;
  undefined8 *local_100;
  
  pcVar1 = &stack0x00000008;
  local_168 = in_R9;
  local_160 = in_R8;
  local_148 = in_RDX;
  local_140 = in_RCX;
  local_169 = should_log(in_stack_fffffffffffffb78,
                         (level_enum)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  local_16a = details::backtracer::enabled((backtracer *)0x2ac6b3);
  if (((local_169 & 1) != 0) || ((bool)local_16a)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffb70,(allocator<char> *)in_stack_fffffffffffffb68);
    ::fmt::v11::basic_appender<char>::basic_appender(local_2b0,local_290);
    local_2c0 = local_148;
    local_2b8 = local_140;
    local_130 = local_160;
    local_138 = local_168;
    local_124 = *local_160;
    local_120 = local_2f8;
    local_110 = local_2e8;
    local_114 = *local_168;
    local_100 = &local_2d0;
    local_108 = local_2f8;
    local_2d0 = 0x11;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffbb4;
    args_00.desc_._0_4_ = in_stack_fffffffffffffbb0;
    args_00.field_1.args_ = in_stack_fffffffffffffbb8.args_;
    local_2f8[0] = local_124;
    local_2e8[0] = local_114;
    local_2c8 = local_108;
    local_300 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffba8,fmt_00,args_00);
    local_368 = *(log_msg **)(pcVar1 + 0x10);
    local_378 = *(undefined8 *)pcVar1;
    uStack_370 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_290);
    count = ::fmt::v11::detail::buffer<char>::size(local_290);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_398,pcVar1,count);
    uVar2 = uStack_370;
    log_msg_00 = local_368;
    details::log_msg::log_msg
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffc10,in_stack_fffffffffffffbf8,
               in_stack_fffffffffffffbdc,in_stack_fffffffffffffbe8);
    log_it_(in_stack_fffffffffffffb80,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x2ac91e);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }